

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

bool __thiscall Network::createQualModel(Network *this)

{
  string *psVar1;
  bool bVar2;
  QualModel *pQVar3;
  SystemError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (this->qualModel != (QualModel *)0x0) {
    (*this->qualModel->_vptr_QualModel[1])();
  }
  psVar1 = (string *)((this->options).stringOptions + 0xb);
  std::__cxx11::string::string((string *)&local_68,psVar1);
  bVar2 = std::operator==(&local_68,"NONE");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    this->qualModel = (QualModel *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,psVar1);
    pQVar3 = QualModel::factory(&local_48);
    this->qualModel = pQVar3;
    std::__cxx11::string::~string((string *)&local_48);
    if (this->qualModel == (QualModel *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,5);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
  }
  return true;
}

Assistant:

bool Network::createQualModel()
{
    if ( qualModel ) delete qualModel;
    if (option(Options::QUAL_MODEL) == "NONE")
    {
        qualModel = nullptr;
        return true;
    }
    qualModel = QualModel::factory(option(Options::QUAL_MODEL));
    if ( qualModel == nullptr )
    {
        throw SystemError(SystemError::QUALITY_MODEL_NOT_OPENED);
    }
	return true;
}